

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_core_module.c
# Opt level: O0

char * ngx_http_core_try_files(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  void *pvVar1;
  long lVar2;
  ngx_array_t **ppnVar3;
  ngx_int_t nVar4;
  undefined8 *puVar5;
  ngx_http_core_main_conf_t *cmcf;
  ngx_http_script_compile_t sc;
  ngx_http_try_file_t *tf;
  ngx_uint_t n;
  ngx_uint_t i;
  ngx_int_t code;
  ngx_str_t *value;
  ngx_http_core_loc_conf_t *clcf;
  void *conf_local;
  ngx_command_t *cmd_local;
  ngx_conf_t *cf_local;
  
  if (*(long *)((long)conf + 0x248) == 0) {
    *(undefined8 *)(*(long *)(*cf->ctx + ngx_http_core_module.ctx_index * 8) + 0xe8) = 1;
    sc._80_8_ = ngx_pcalloc(cf->pool,cf->args->nelts * 0x28);
    if ((void *)sc._80_8_ == (void *)0x0) {
      cf_local = (ngx_conf_t *)0xffffffffffffffff;
    }
    else {
      *(undefined8 *)((long)conf + 0x248) = sc._80_8_;
      pvVar1 = cf->args->elts;
      for (n = 0; n < cf->args->nelts - 1; n = n + 1) {
        lVar2 = sc._80_8_ + n * 0x28;
        puVar5 = (undefined8 *)((long)pvVar1 + (n + 1) * 0x10);
        *(undefined8 *)(lVar2 + 0x10) = *puVar5;
        *(undefined8 *)(lVar2 + 0x18) = puVar5[1];
        if (((*(long *)(sc._80_8_ + n * 0x28 + 0x10) != 0) &&
            (*(char *)(*(long *)(sc._80_8_ + n * 0x28 + 0x18) +
                      *(long *)(sc._80_8_ + n * 0x28 + 0x10) + -1) == '/')) &&
           (n + 2 < cf->args->nelts)) {
          lVar2 = sc._80_8_ + n * 0x28;
          *(ushort *)(lVar2 + 0x20) = *(ushort *)(lVar2 + 0x20) & 0xfbff | 0x400;
          lVar2 = sc._80_8_ + n * 0x28;
          *(long *)(lVar2 + 0x10) = *(long *)(lVar2 + 0x10) + -1;
          *(undefined1 *)
           (*(long *)(sc._80_8_ + n * 0x28 + 0x18) + *(long *)(sc._80_8_ + n * 0x28 + 0x10)) = 0;
        }
        ppnVar3 = (ngx_array_t **)
                  ngx_http_script_variables_count((ngx_str_t *)(sc._80_8_ + n * 0x28 + 0x10));
        if (ppnVar3 == (ngx_array_t **)0x0) {
          lVar2 = sc._80_8_ + n * 0x28;
          *(long *)(lVar2 + 0x10) = *(long *)(lVar2 + 0x10) + 1;
        }
        else {
          memset(&cmcf,0,0x58);
          sc.cf = (ngx_conf_t *)(sc._80_8_ + n * 0x28 + 0x10);
          sc.flushes = (ngx_array_t **)(sc._80_8_ + n * 0x28);
          sc.lengths = (ngx_array_t **)(sc._80_8_ + n * 0x28 + 8);
          sc.main._0_1_ = (byte)sc.main & 0xf9 | 6;
          cmcf = (ngx_http_core_main_conf_t *)cf;
          sc.values = ppnVar3;
          nVar4 = ngx_http_script_compile((ngx_http_script_compile_t *)&cmcf);
          if (nVar4 != 0) {
            return (char *)0xffffffffffffffff;
          }
        }
      }
      if (**(char **)(sc._80_8_ + (n - 1) * 0x28 + 0x18) == '=') {
        nVar4 = ngx_atoi((u_char *)(*(long *)(sc._80_8_ + (n - 1) * 0x28 + 0x18) + 1),
                         *(long *)(sc._80_8_ + (n - 1) * 0x28 + 0x10) - 2);
        if ((nVar4 == -1) || (999 < nVar4)) {
          ngx_conf_log_error(1,cf,0,"invalid code \"%*s\"",
                             *(long *)(sc._80_8_ + (n - 1) * 0x28 + 0x10) + -1,
                             *(undefined8 *)(sc._80_8_ + (n - 1) * 0x28 + 0x18));
          return (char *)0xffffffffffffffff;
        }
        lVar2 = sc._80_8_ + n * 0x28;
        *(ushort *)(lVar2 + 0x20) = *(ushort *)(lVar2 + 0x20) & 0xfc00 | (ushort)nVar4 & 0x3ff;
      }
      cf_local = (ngx_conf_t *)0x0;
    }
  }
  else {
    cf_local = (ngx_conf_t *)anon_var_dwarf_1243;
  }
  return (char *)cf_local;
}

Assistant:

static char *
ngx_http_core_try_files(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_core_loc_conf_t *clcf = conf;

    ngx_str_t                  *value;
    ngx_int_t                   code;
    ngx_uint_t                  i, n;
    ngx_http_try_file_t        *tf;
    ngx_http_script_compile_t   sc;
    ngx_http_core_main_conf_t  *cmcf;

    if (clcf->try_files) {
        return "is duplicate";
    }

    cmcf = ngx_http_conf_get_module_main_conf(cf, ngx_http_core_module);

    cmcf->try_files = 1;

    tf = ngx_pcalloc(cf->pool, cf->args->nelts * sizeof(ngx_http_try_file_t));
    if (tf == NULL) {
        return NGX_CONF_ERROR;
    }

    clcf->try_files = tf;

    value = cf->args->elts;

    for (i = 0; i < cf->args->nelts - 1; i++) {

        tf[i].name = value[i + 1];

        if (tf[i].name.len > 0
            && tf[i].name.data[tf[i].name.len - 1] == '/'
            && i + 2 < cf->args->nelts)
        {
            tf[i].test_dir = 1;
            tf[i].name.len--;
            tf[i].name.data[tf[i].name.len] = '\0';
        }

        n = ngx_http_script_variables_count(&tf[i].name);

        if (n) {
            ngx_memzero(&sc, sizeof(ngx_http_script_compile_t));

            sc.cf = cf;
            sc.source = &tf[i].name;
            sc.lengths = &tf[i].lengths;
            sc.values = &tf[i].values;
            sc.variables = n;
            sc.complete_lengths = 1;
            sc.complete_values = 1;

            if (ngx_http_script_compile(&sc) != NGX_OK) {
                return NGX_CONF_ERROR;
            }

        } else {
            /* add trailing '\0' to length */
            tf[i].name.len++;
        }
    }

    if (tf[i - 1].name.data[0] == '=') {

        code = ngx_atoi(tf[i - 1].name.data + 1, tf[i - 1].name.len - 2);

        if (code == NGX_ERROR || code > 999) {
            ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                               "invalid code \"%*s\"",
                               tf[i - 1].name.len - 1, tf[i - 1].name.data);
            return NGX_CONF_ERROR;
        }

        tf[i].code = code;
    }

    return NGX_CONF_OK;
}